

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.h
# Opt level: O1

ArrayBufferDetachedStateBase * __thiscall
Js::ProjectionArrayBuffer::CreateDetachedState
          (ProjectionArrayBuffer *this,RefCountedBuffer *content,uint32 bufferLength)

{
  Recycler *pRVar1;
  HeapAllocator *alloc;
  ArrayBufferDetachedStateBase *pAVar2;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&ArrayBuffer::ArrayBufferDetachedState<void(*)(void*)>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_16a58;
  data.filename._0_4_ = 0x173;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
  pAVar2 = (ArrayBufferDetachedStateBase *)new<Memory::HeapAllocator>(0x30,alloc,0x300d4a);
  pRVar1 = ((((((this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr)->recycler;
  (pAVar2->super_DetachedStateBase).typeId = TypeIds_ArrayBuffer;
  (pAVar2->super_DetachedStateBase).hasBeenClaimed = false;
  pAVar2->buffer = content;
  pAVar2->bufferLength = bufferLength;
  pAVar2->allocationType = CoTask;
  (pAVar2->super_DetachedStateBase)._vptr_DetachedStateBase =
       (_func_int **)&PTR__DetachedStateBase_014cf040;
  pAVar2[1].super_DetachedStateBase._vptr_DetachedStateBase = (_func_int **)CoTaskMemFree;
  *(Recycler **)&pAVar2[1].super_DetachedStateBase.typeId = pRVar1;
  return pAVar2;
}

Assistant:

virtual ArrayBufferDetachedStateBase* CreateDetachedState(RefCountedBuffer * content, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength) override
        {
            return HeapNew(ArrayBufferDetachedState<FreeFn>, content, bufferLength, CoTaskMemFree, GetScriptContext()->GetRecycler(), ArrayBufferAllocationType::CoTask);
        }